

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta.cpp
# Opt level: O3

void cpp_client::morph_any(Any *to_morph,Value *val)

{
  undefined4 uVar1;
  _Head_base<0UL,_cpp_client::Any::holder_*,_false> _Var2;
  int iVar3;
  undefined *puVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Head_base<0UL,_cpp_client::Any::holder_*,_false> _Var5;
  Ch *pCVar6;
  undefined4 extraout_var_01;
  type pbVar7;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  type piVar8;
  undefined4 extraout_var_05;
  type pdVar9;
  Bad_manipulation *this;
  pointer_____offset_0x10___ *ppuVar10;
  char *pcVar11;
  uint uVar12;
  char *__s1;
  bool bVar13;
  allocator local_69;
  _func_int **local_68;
  _Head_base<0UL,_cpp_client::Any::holder_*,_false> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  
  _Var5._M_head_impl =
       (to_morph->data_)._M_t.
       super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
       ._M_t.
       super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
       .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl;
  puVar4 = &void::typeinfo;
  if (_Var5._M_head_impl != (holder *)0x0) {
    iVar3 = (*(_Var5._M_head_impl)->_vptr_holder[2])();
    puVar4 = (undefined *)CONCAT44(extraout_var,iVar3);
  }
  __s1 = _bcmp;
  pcVar11 = *(char **)(puVar4 + 8);
  if (pcVar11 == _bcmp) {
    uVar12 = val->flags_;
    if ((uVar12 >> 8 & 1) != 0) {
LAB_0011f8c6:
      _Var5._M_head_impl = (holder *)operator_new(0x10);
      (_Var5._M_head_impl)->_vptr_holder = (_func_int **)&PTR__holder_0013a318;
      *(bool *)&_Var5._M_head_impl[1]._vptr_holder = uVar12 == 0x102;
      goto LAB_0011f8e5;
    }
    bVar13 = true;
LAB_0011f726:
    if ((uVar12 >> 10 & 1) != 0) {
      _Var5._M_head_impl =
           (to_morph->data_)._M_t.
           super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
           ._M_t.
           super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
           .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl;
      pcVar11 = __s1;
      if (_Var5._M_head_impl != (holder *)0x0) {
        iVar3 = (*(_Var5._M_head_impl)->_vptr_holder[2])(_Var5._M_head_impl);
        pcVar11 = *(char **)(CONCAT44(extraout_var_00,iVar3) + 8);
      }
      if ((pcVar11 != _typeinfo) &&
         ((*pcVar11 == '*' || (iVar3 = strcmp(pcVar11,_typeinfo), iVar3 != 0)))) {
        if (bVar13) {
          if ((val->flags_ & 0x400) == 0) goto LAB_0011facd;
          uVar1 = *(undefined4 *)&val->data_;
          _Var5._M_head_impl = (holder *)operator_new(0x10);
          (_Var5._M_head_impl)->_vptr_holder = (_func_int **)&PTR__holder_0013a590;
          *(undefined4 *)&_Var5._M_head_impl[1]._vptr_holder = uVar1;
          goto LAB_0011f8e5;
        }
        _Var5._M_head_impl =
             (to_morph->data_)._M_t.
             super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
             ._M_t.
             super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
             .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl;
        if (_Var5._M_head_impl != (holder *)0x0) {
          iVar3 = (*(_Var5._M_head_impl)->_vptr_holder[2])();
          __s1 = *(char **)(CONCAT44(extraout_var_04,iVar3) + 8);
        }
        if ((__s1 == _put) || ((*__s1 != '*' && (iVar3 = strcmp(__s1,_put), iVar3 == 0)))) {
          if ((val->flags_ & 0x400) != 0) {
            iVar3 = *(int *)&val->data_;
            piVar8 = Any::as<int>(to_morph);
            *piVar8 = iVar3;
            return;
          }
LAB_0011facd:
          __assert_fail("flags_ & kIntFlag",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/siggame[P]Joueur/joueur/libraries/rapidjson/include/rapidjson/document.h"
                        ,0x594,
                        "int rapidjson::GenericValue<rapidjson::UTF8<>>::GetInt() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                       );
        }
        this = (Bad_manipulation *)__cxa_allocate_exception(0x10);
        Bad_manipulation::runtime_error(this,"Integer assigned to non-Integer.");
        goto LAB_0011fb69;
      }
    }
    uVar12 = val->flags_;
    if ((uVar12 >> 0x14 & 1) == 0) {
      if ((uVar12 >> 9 & 1) == 0) {
        if (uVar12 == 0) {
          local_58._M_dataplus._M_p = (pointer)0x0;
          local_58._M_string_length = 0;
          _Var5._M_head_impl =
               (to_morph->data_)._M_t.
               super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
               ._M_t.
               super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
               .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl;
          if (_Var5._M_head_impl == (holder *)0x0) {
            return;
          }
          (*(_Var5._M_head_impl)->_vptr_holder[5])(_Var5._M_head_impl,&local_58);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length ==
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            return;
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
          return;
        }
        this = (Bad_manipulation *)__cxa_allocate_exception(0x10);
        Bad_response::runtime_error((Bad_response *)this,"Unknown JSON type received in a delta.");
        ppuVar10 = &Bad_response::typeinfo;
        goto LAB_0011fb70;
      }
      if (bVar13) {
        local_68 = (_func_int **)
                   rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::GetDouble(val);
        _Var5._M_head_impl = (holder *)operator_new(0x10);
        (_Var5._M_head_impl)->_vptr_holder = (_func_int **)&PTR__holder_0013a5f8;
        _Var5._M_head_impl[1]._vptr_holder = local_68;
LAB_0011f8e5:
        _Var2._M_head_impl =
             (to_morph->data_)._M_t.
             super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
             ._M_t.
             super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
             .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl;
        (to_morph->data_)._M_t.
        super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
        ._M_t.
        super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
        .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl = _Var5._M_head_impl;
        if (_Var2._M_head_impl == (holder *)0x0) {
          return;
        }
        (*(_Var2._M_head_impl)->_vptr_holder[1])();
        return;
      }
      _Var5._M_head_impl =
           (to_morph->data_)._M_t.
           super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
           ._M_t.
           super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
           .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl;
      if (_Var5._M_head_impl != (holder *)0x0) {
        iVar3 = (*(_Var5._M_head_impl)->_vptr_holder[2])();
        __s1 = *(char **)(CONCAT44(extraout_var_05,iVar3) + 8);
      }
      if ((__s1 == _typeinfo) || ((*__s1 != '*' && (iVar3 = strcmp(__s1,_typeinfo), iVar3 == 0)))) {
        local_68 = (_func_int **)
                   rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::GetDouble(val);
        pdVar9 = Any::as<double>(to_morph);
        *pdVar9 = (double)local_68;
        return;
      }
      this = (Bad_manipulation *)__cxa_allocate_exception(0x10);
      Bad_manipulation::runtime_error(this,"Double assigned to non-double.");
    }
    else {
      if (bVar13) {
        pCVar6 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetString(val);
        std::__cxx11::string::string((string *)&local_58,pCVar6,&local_69);
        Any::Any<std::__cxx11::string>((Any *)&local_60,&local_58);
        _Var2._M_head_impl = local_60._M_head_impl;
        local_60._M_head_impl = (holder *)0x0;
        _Var5._M_head_impl =
             (to_morph->data_)._M_t.
             super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
             ._M_t.
             super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
             .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl;
        (to_morph->data_)._M_t.
        super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
        ._M_t.
        super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
        .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl = _Var2._M_head_impl;
        if ((_Var5._M_head_impl != (holder *)0x0) &&
           ((*(_Var5._M_head_impl)->_vptr_holder[1])(), local_60._M_head_impl != (holder *)0x0)) {
          (*(local_60._M_head_impl)->_vptr_holder[1])();
        }
        local_60._M_head_impl = (holder *)0x0;
LAB_0011f9b8:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        return;
      }
      _Var5._M_head_impl =
           (to_morph->data_)._M_t.
           super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
           ._M_t.
           super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
           .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl;
      if (_Var5._M_head_impl != (holder *)0x0) {
        iVar3 = (*(_Var5._M_head_impl)->_vptr_holder[2])();
        __s1 = *(char **)(CONCAT44(extraout_var_02,iVar3) + 8);
      }
      if ((__s1 == "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") ||
         ((*__s1 != '*' &&
          (iVar3 = strcmp(__s1,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE"), iVar3 == 0))
         )) {
        pCVar6 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetString(val);
        std::__cxx11::string::string((string *)&local_58,pCVar6,(allocator *)&local_60);
        iVar3 = (*((to_morph->data_)._M_t.
                   super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
                   .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl)->
                  _vptr_holder[3])();
        std::__cxx11::string::operator=
                  ((string *)CONCAT44(extraout_var_03,iVar3),(string *)&local_58);
        goto LAB_0011f9b8;
      }
      this = (Bad_manipulation *)__cxa_allocate_exception(0x10);
      Bad_manipulation::runtime_error(this,"String assigned to non-string.");
    }
  }
  else {
    if (*pcVar11 == '*') {
      uVar12 = val->flags_;
      if ((uVar12 >> 8 & 1) == 0) {
        bVar13 = false;
        goto LAB_0011f726;
      }
    }
    else {
      iVar3 = strcmp(pcVar11,_bcmp);
      bVar13 = iVar3 == 0;
      uVar12 = val->flags_;
      if ((uVar12 >> 8 & 1) == 0) goto LAB_0011f726;
      if (iVar3 == 0) goto LAB_0011f8c6;
    }
    _Var5._M_head_impl =
         (to_morph->data_)._M_t.
         super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
         ._M_t.
         super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
         .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl;
    if (_Var5._M_head_impl != (holder *)0x0) {
      iVar3 = (*(_Var5._M_head_impl)->_vptr_holder[2])();
      __s1 = *(char **)(CONCAT44(extraout_var_01,iVar3) + 8);
    }
    if ((__s1 == _replace) || ((*__s1 != '*' && (iVar3 = strcmp(__s1,_replace), iVar3 == 0)))) {
      uVar12 = val->flags_;
      if ((uVar12 >> 8 & 1) != 0) {
        pbVar7 = Any::as<bool>(to_morph);
        *pbVar7 = uVar12 == 0x102;
        return;
      }
      __assert_fail("IsBool()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/siggame[P]Joueur/joueur/libraries/rapidjson/include/rapidjson/document.h"
                    ,0x31a,
                    "bool rapidjson::GenericValue<rapidjson::UTF8<>>::GetBool() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                   );
    }
    this = (Bad_manipulation *)__cxa_allocate_exception(0x10);
    Bad_manipulation::runtime_error(this,"Boolean assigned to non-Boolean.");
  }
LAB_0011fb69:
  ppuVar10 = &Bad_manipulation::typeinfo;
LAB_0011fb70:
  __cxa_throw(this,ppuVar10,std::runtime_error::~runtime_error);
}

Assistant:

void morph_any(Any& to_morph, const rapidjson::Value& val)
{
   const bool no_type = (to_morph.type() == typeid(void));
   //otherwise just create the Any from it via this stupid if-else block
   if(val.IsBool())
   {
      if(!no_type && to_morph.type() != typeid(bool))
      {
         throw Bad_manipulation("Boolean assigned to non-Boolean.");
      }
      if(no_type)
      {
         to_morph = Any{val.GetBool()};
      }
      else
      {
         to_morph.as<bool>() = val.GetBool();
      }
   }
   else if(val.IsInt() && to_morph.type() != typeid(double))
   {
      if(!no_type && to_morph.type() != typeid(int))
      {
         throw Bad_manipulation("Integer assigned to non-Integer.");
      }
      if(no_type)
      {
         to_morph = Any{val.GetInt()};
      }
      else
      {
         to_morph.as<int>() = val.GetInt();
      }
   }
   else if(val.IsString())
   {
      if(!no_type && to_morph.type() != typeid(std::string))
      {
         throw Bad_manipulation("String assigned to non-string.");
      }
      if(no_type)
      {
         to_morph = Any{std::string{val.GetString()}};
      }
      else
      {
         to_morph.as<std::string>() = std::string{val.GetString()};
      }
   }
   else if(val.IsNumber())
   {
      if(!no_type && to_morph.type() != typeid(double))
      {
         throw Bad_manipulation("Double assigned to non-double.");
      }
      if(no_type)
      {
         to_morph = Any{static_cast<double>(val.GetDouble())};
      }
      else
      {
         to_morph.as<double>() = static_cast<double>(val.GetDouble());
      }
   }
   else if(val.IsNull())
   {
      to_morph.reset();
   }
   else
   {
      //some kind of weird gross type that's icky
      throw Bad_response("Unknown JSON type received in a delta.");
   }
}